

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O2

void * install_response_handler
                 (CManager cm,int stone_id,char *response_spec,void *param_4,FMFormat **ref_ptr)

{
  FMFormat **ppp_Var1;
  CManager cm_00;
  int iVar2;
  char *pcVar3;
  FMStructDescRec *pFVar4;
  undefined4 *puVar5;
  FMStructDescList p_Var6;
  FMStructDescList list;
  void *pvVar7;
  size_t sVar8;
  char *pcVar9;
  void *pvVar10;
  FMFormat p_Var11;
  FMFormat *pp_Var12;
  ulong uVar13;
  ulong uVar14;
  FMStructDescList p_Var15;
  FMStructDescRec *pFVar16;
  long lVar17;
  int format_count;
  FMFormat **local_58;
  undefined4 *local_50;
  void *local_48;
  CManager local_40;
  int local_38;
  int format_count2;
  
  local_40 = cm;
  iVar2 = strncmp("Terminal Action",response_spec,0xf);
  if (iVar2 == 0) {
    __isoc99_sscanf(response_spec + 0x10,"  Format Count %d\n",&format_count);
    pcVar3 = strchr(response_spec + 0x10,10);
    response_spec = pcVar3 + 1;
    pFVar4 = (FMStructDescRec *)INT_CMmalloc((long)format_count * 0x20 + 0x20);
    pFVar16 = pFVar4;
    for (lVar17 = 0; lVar17 < format_count; lVar17 = lVar17 + 1) {
      response_spec = parse_FMformat_from_string(response_spec,pFVar16);
      pFVar16 = pFVar16 + 1;
    }
    pFVar4[format_count].format_name = (char *)0x0;
  }
  iVar2 = strncmp("Filter Action",response_spec,0xd);
  local_58 = ref_ptr;
  local_48 = param_4;
  if (iVar2 == 0) {
    puVar5 = (undefined4 *)INT_CMmalloc(0x48);
    __isoc99_sscanf(response_spec + 0xe,"  Format Count %d\n",&format_count);
    pcVar3 = strchr(response_spec + 0xe,10);
    pcVar3 = pcVar3 + 1;
    p_Var6 = (FMStructDescList)INT_CMmalloc((long)format_count * 0x20 + 0x20);
    p_Var15 = p_Var6;
    for (lVar17 = 0; lVar17 < format_count; lVar17 = lVar17 + 1) {
      pcVar3 = parse_FMformat_from_string(pcVar3,p_Var15);
      p_Var15 = p_Var15 + 1;
    }
    p_Var6[format_count].format_name = (char *)0x0;
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)INT_CMmalloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
    *puVar5 = 0;
  }
  else {
    iVar2 = strncmp("Router Action",response_spec,0xd);
    if (iVar2 != 0) {
      iVar2 = strncmp("Transform Action",response_spec,0x10);
      if (iVar2 == 0) {
        local_50 = (undefined4 *)INT_CMmalloc(0x48);
        __isoc99_sscanf(response_spec + 0x11,"  Input Format Count %d\n",&format_count);
        pcVar3 = strchr(response_spec + 0x11,10);
        pcVar3 = pcVar3 + 1;
        p_Var6 = (FMStructDescList)INT_CMmalloc((long)format_count * 0x20 + 0x20);
        p_Var15 = p_Var6;
        for (lVar17 = 0; lVar17 < format_count; lVar17 = lVar17 + 1) {
          pcVar3 = parse_FMformat_from_string(pcVar3,p_Var15);
          p_Var15 = p_Var15 + 1;
        }
        p_Var6[format_count].format_name = (char *)0x0;
        p_Var6[format_count].field_list = (FMFieldList)0x0;
        iVar2 = __isoc99_sscanf(pcVar3,"  Output Format Count %d\n",&format_count);
        if (iVar2 == 1) {
          pcVar3 = strchr(pcVar3,10);
          pcVar3 = pcVar3 + 1;
          list = (FMStructDescList)INT_CMmalloc((long)format_count * 0x20 + 0x20);
          p_Var15 = list;
          for (lVar17 = 0; lVar17 < format_count; lVar17 = lVar17 + 1) {
            pcVar3 = parse_FMformat_from_string(pcVar3,p_Var15);
            p_Var15 = p_Var15 + 1;
          }
          list[format_count].format_name = (char *)0x0;
          list[format_count].field_list = (FMFieldList)0x0;
          sVar8 = strlen(pcVar3);
          pcVar9 = (char *)INT_CMmalloc(sVar8 + 1);
          strcpy(pcVar9,pcVar3);
          puVar5 = local_50;
          *local_50 = 1;
          *(FMStructDescList *)(local_50 + 2) = p_Var6;
          *(FMStructDescList *)(local_50 + 4) = list;
          *(char **)(local_50 + 6) = pcVar9;
          *(void **)(local_50 + 8) = param_4;
          *(undefined8 *)(local_50 + 10) = 0;
          if (p_Var6->format_name != (char *)0x0) {
            p_Var11 = EVregister_format_set(local_40,p_Var6);
            *(FMFormat *)(puVar5 + 10) = p_Var11;
          }
          ppp_Var1 = local_58;
          if (local_58 != (FMFormat **)0x0) {
            pp_Var12 = (FMFormat *)INT_CMmalloc(0x10);
            pp_Var12[1] = (FMFormat)0x0;
            *pp_Var12 = *(FMFormat *)(local_50 + 10);
            *ppp_Var1 = pp_Var12;
          }
          puVar5 = local_50;
          if (list->format_name != (char *)0x0) {
            p_Var11 = EVregister_format_set(local_40,list);
            *(FMFormat *)(puVar5 + 0xc) = p_Var11;
          }
          puVar5[0x10] = list->struct_size;
          return puVar5;
        }
        puts("output format parse failed");
        return (void *)0x0;
      }
      iVar2 = strncmp("Multityped Action",response_spec,0x11);
      if (iVar2 != 0) {
        printf("Unparsed action : %s\n",response_spec);
        return (void *)0x0;
      }
      local_50 = (undefined4 *)INT_CMmalloc(0x48);
      __isoc99_sscanf(response_spec + 0x12,"  List Count %d\n",&format_count);
      pcVar3 = strchr(response_spec + 0x12,10);
      pcVar3 = pcVar3 + 1;
      pvVar7 = INT_CMmalloc((long)format_count * 8 + 8);
      local_38 = 0;
      for (iVar2 = 0; iVar2 < format_count; iVar2 = iVar2 + 1) {
        __isoc99_sscanf(pcVar3,"Next format   Subformat Count %d\n",&format_count2);
        pcVar3 = strchr(pcVar3,10);
        pcVar3 = pcVar3 + 1;
        pFVar4 = (FMStructDescRec *)INT_CMmalloc((long)format_count2 * 0x20 + 0x20);
        pFVar16 = pFVar4;
        for (lVar17 = 0; lVar17 < format_count2; lVar17 = lVar17 + 1) {
          pcVar3 = parse_FMformat_from_string(pcVar3,pFVar16);
          pFVar16 = pFVar16 + 1;
        }
        pFVar4[format_count2].format_name = (char *)0x0;
        pFVar4[format_count2].field_list = (FMFieldList)0x0;
        *(FMStructDescRec **)((long)pvVar7 + (long)iVar2 * 8) = pFVar4;
        if (pFVar4->field_list == (FMFieldList)0x0) {
          free(pFVar4->format_name);
          free(pFVar4);
          *(undefined8 *)((long)pvVar7 + (long)iVar2 * 8) = 0;
          format_count = format_count + -1;
          iVar2 = iVar2 + -1;
          local_38 = local_38 + 1;
        }
      }
      *(undefined8 *)((long)pvVar7 + (long)format_count * 8) = 0;
      sVar8 = strlen(pcVar3);
      pcVar9 = (char *)INT_CMmalloc(sVar8 + 1);
      strcpy(pcVar9,pcVar3);
      puVar5 = local_50;
      *local_50 = 3;
      *(void **)(local_50 + 2) = pvVar7;
      *(char **)(local_50 + 4) = pcVar9;
      *(void **)(local_50 + 6) = local_48;
      local_50[8] = local_38;
      pvVar10 = INT_CMmalloc((long)format_count * 8 + 8);
      cm_00 = local_40;
      ppp_Var1 = local_58;
      *(void **)(puVar5 + 10) = pvVar10;
      for (lVar17 = 0; lVar17 < format_count; lVar17 = lVar17 + 1) {
        p_Var15 = *(FMStructDescList *)((long)pvVar7 + lVar17 * 8);
        if (p_Var15->format_name != (char *)0x0) {
          p_Var11 = EVregister_format_set(cm_00,p_Var15);
          *(FMFormat *)(*(long *)(puVar5 + 10) + lVar17 * 8) = p_Var11;
        }
      }
      if (ppp_Var1 == (FMFormat **)0x0) {
        return puVar5;
      }
      pp_Var12 = (FMFormat *)INT_CMmalloc((long)format_count * 8 + 8);
      uVar13 = 0;
      uVar14 = 0;
      if (0 < format_count) {
        uVar14 = (ulong)(uint)format_count;
      }
      for (; uVar14 != uVar13; uVar13 = uVar13 + 1) {
        pp_Var12[uVar13] = *(FMFormat *)(*(long *)(puVar5 + 10) + uVar13 * 8);
      }
      pp_Var12[format_count] = (FMFormat)0x0;
      *ppp_Var1 = pp_Var12;
      return puVar5;
    }
    puVar5 = (undefined4 *)INT_CMmalloc(0x48);
    __isoc99_sscanf(response_spec + 0xe,"  Format Count %d\n",&format_count);
    pcVar3 = strchr(response_spec + 0xe,10);
    pcVar3 = pcVar3 + 1;
    p_Var6 = (FMStructDescList)INT_CMmalloc((long)format_count * 0x20 + 0x20);
    p_Var15 = p_Var6;
    for (lVar17 = 0; lVar17 < format_count; lVar17 = lVar17 + 1) {
      pcVar3 = parse_FMformat_from_string(pcVar3,p_Var15);
      p_Var15 = p_Var15 + 1;
    }
    p_Var6[format_count].format_name = (char *)0x0;
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)INT_CMmalloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
    *puVar5 = 2;
  }
  *(FMStructDescList *)(puVar5 + 2) = p_Var6;
  *(char **)(puVar5 + 4) = pcVar9;
  *(void **)(puVar5 + 6) = local_48;
  p_Var11 = EVregister_format_set(local_40,p_Var6);
  ppp_Var1 = local_58;
  *(FMFormat *)(puVar5 + 8) = p_Var11;
  if (local_58 != (FMFormat **)0x0) {
    pp_Var12 = (FMFormat *)INT_CMmalloc(0x10);
    pp_Var12[1] = (FMFormat)0x0;
    *pp_Var12 = *(FMFormat *)(puVar5 + 8);
    *ppp_Var1 = pp_Var12;
  }
  return puVar5;
}

Assistant:

void *
install_response_handler(CManager cm, int stone_id, char *response_spec,
			 void *local_data, FMFormat **ref_ptr)
{
    char *str = response_spec;
    (void)stone_id;
    if (strncmp("Terminal Action", str, strlen("Terminal Action")) == 0) {
	int format_count, i;
	FMStructDescList list;
	str += strlen("Terminal Action") + 1;
	sscanf(str, "  Format Count %d\n", &format_count);
	str = strchr(str, '\n') + 1;
	list = malloc(sizeof(list[0]) * (format_count + 1));
	for (i=0; i < format_count; i++) {
	    str = parse_FMformat_from_string(str, &list[i]);
	}
	list[format_count].format_name = NULL;
/*	INT_EVassoc_terminal_action(cm, stone_id, list, local_data, NULL);*/
    }
    if (strncmp("Filter Action", str, strlen("Filter Action")) == 0) {
	struct response_spec *response = malloc(sizeof(struct response_spec));
	int format_count, i;
	char *function;
	FMStructDescList list;
	str += strlen("Filter Action") + 1;
	sscanf(str, "  Format Count %d\n", &format_count);
	str = strchr(str, '\n') + 1;
	list = malloc(sizeof(list[0]) * (format_count + 1));
	for (i=0; i < format_count; i++) {
	    str = parse_FMformat_from_string(str, &list[i]);
	}
	list[format_count].format_name = NULL;
	function = malloc(strlen(str) + 1);
	strcpy(function, str);
	response->response_type = Response_Filter;
	response->u.filter.format_list = list;
	response->u.filter.function = function;
	response->u.filter.client_data = local_data;
	response->u.filter.reference_format =
	    EVregister_format_set(cm, list);
	if (ref_ptr) {
	    FMFormat *formats = malloc(2*sizeof(FMFormat));
	    formats[1] = NULL;
	    formats[0] = response->u.filter.reference_format;

	    *ref_ptr = formats;
	}
	return (void*)response;
    }
    if (strncmp("Router Action", str, strlen("Router Action")) == 0) {
	struct response_spec *response = malloc(sizeof(struct response_spec));
	int format_count, i;
	char *function;
	FMStructDescList list;
	str += strlen("Router Action") + 1;
	sscanf(str, "  Format Count %d\n", &format_count);
	str = strchr(str, '\n') + 1;
	list = malloc(sizeof(list[0]) * (format_count + 1));
	for (i=0; i < format_count; i++) {
	    str = parse_FMformat_from_string(str, &list[i]);
	}
	list[format_count].format_name = NULL;
	function = malloc(strlen(str) + 1);
	strcpy(function, str);
	response->response_type = Response_Router;
	response->u.filter.format_list = list;
	response->u.filter.function = function;
	response->u.filter.client_data = local_data;
	response->u.filter.reference_format =
	    EVregister_format_set(cm, list);
	if (ref_ptr) {
	    FMFormat *formats = malloc(2*sizeof(FMFormat));
	    formats[1] = NULL;
	    formats[0] = response->u.filter.reference_format;

	    *ref_ptr = formats;
	}
	return (void*)response;
    }
    if (strncmp("Transform Action", str, strlen("Transform Action")) == 0) {
	struct response_spec *response = malloc(sizeof(struct response_spec));
	int format_count, i;
	char *function;
	FMStructDescList in_list, out_list;
	str += strlen("Transform Action") + 1;
	sscanf(str, "  Input Format Count %d\n", &format_count);
	str = strchr(str, '\n') + 1;
	in_list = malloc(sizeof(in_list[0]) * (format_count + 1));
	for (i=0; i < format_count; i++) {
	    str = parse_FMformat_from_string(str, &in_list[i]);
	}
	in_list[format_count].format_name = NULL;
	in_list[format_count].field_list = NULL;
	if (sscanf(str, "  Output Format Count %d\n", &format_count) != 1) {
	    printf("output format parse failed\n");
	    return 0;
	}
	str = strchr(str, '\n') + 1;
	out_list = malloc(sizeof(out_list[0]) * (format_count + 1));
	for (i=0; i < format_count; i++) {
	    str = parse_FMformat_from_string(str, &out_list[i]);
	}
	out_list[format_count].format_name = NULL;
	out_list[format_count].field_list = NULL;
	function = malloc(strlen(str) + 1);
	strcpy(function, str);
	response->response_type = Response_Transform;
	response->u.transform.in_format_list = in_list;
	response->u.transform.out_format_list = out_list;
	response->u.transform.function = function;
	response->u.transform.client_data = local_data;
	response->u.transform.reference_input_format = NULL;
	if (in_list[0].format_name != NULL)
	    response->u.transform.reference_input_format =
		EVregister_format_set(cm, in_list);
	if (ref_ptr) {
	    FMFormat *formats = malloc(2*sizeof(FMFormat));
	    formats[1] = NULL;
	    formats[0] = response->u.transform.reference_input_format;
	    *ref_ptr = formats;
	}
	if (out_list[0].format_name != NULL)
	    response->u.transform.reference_output_format =
		EVregister_format_set(cm, out_list);
	response->u.transform.output_base_struct_size = out_list[0].struct_size;
	return (void*)response;
    }
    if (strncmp("Multityped Action", str, strlen("Multityped Action")) == 0) {
	struct response_spec *response = malloc(sizeof(struct response_spec));
	int list_count, j;
	char *function;
	FMStructDescList *struct_list;
	int accept_anonymous = 0;

	str += strlen("Multityped Action") + 1;
	sscanf(str, "  List Count %d\n", &list_count);
	str = strchr(str, '\n') + 1;
	struct_list = malloc(sizeof(struct_list[0]) * (list_count + 1));
	for (j = 0; j < list_count; j++) {
	    int format_count2, k;
	    FMStructDescList in_list;
	    sscanf(str, "Next format   Subformat Count %d\n", &format_count2);
	    str = strchr(str, '\n') + 1;

	    in_list = malloc(sizeof(in_list[0]) * (format_count2 + 1));
	    for (k=0; k < format_count2; k++) {
		str = parse_FMformat_from_string(str, &in_list[k]);
	    }
	    in_list[format_count2].format_name = NULL;
	    in_list[format_count2].field_list = NULL;
	    struct_list[j] = in_list;
	    if (struct_list[j]->field_list == NULL) {  /* anonymous */
		free((void*)struct_list[j]->format_name);
		free(in_list);
		struct_list[j] = NULL;
		list_count--;
		j--;
		accept_anonymous++;
	    }
	}
	struct_list[list_count] = NULL;
	function = malloc(strlen(str) + 1);
	strcpy(function, str);
	response->response_type = Response_Multityped;
	response->u.multityped.struct_list = struct_list;
	response->u.multityped.function = function;
	response->u.multityped.client_data = local_data;
	response->u.multityped.accept_anonymous = accept_anonymous;
	response->u.multityped.reference_input_format_list =
	    malloc((list_count +1) * sizeof(FMFormat));
	for (j = 0; j < list_count; j++) {
	    if ((struct_list[j])[0].format_name != NULL) {
		response->u.multityped.reference_input_format_list[j] =
		    EVregister_format_set(cm, struct_list[j]);
	    }
	}
	if (ref_ptr) {
	    FMFormat *formats = malloc((list_count + 1)*sizeof(FMFormat));
	    int k = 0;
	    for (k=0; k < list_count; k++) {
		formats[k] = response->u.multityped.reference_input_format_list[k];
	    }
	    formats[list_count] = NULL;
	    *ref_ptr = formats;
	}
	return (void*)response;
    }
    printf("Unparsed action : %s\n", str);
    return NULL;
}